

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O1

int query_int(char *prompt,int minimum,int maximum)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int res;
  char str [1024];
  int local_444;
  int local_440;
  int local_43c;
  char local_438 [1032];
  
  local_43c = maximum;
  do {
    local_444 = 0;
    printf("%s",prompt);
    pcVar3 = fgets(local_438,0x400,_stdin);
    if (pcVar3 == (char *)0x0) {
      exit(1);
    }
    iVar2 = __isoc99_sscanf(local_438,"%d",&local_444);
    if (iVar2 == 1) {
      if (local_444 < minimum || local_43c < local_444) {
        puts("Invalid number entered!");
        goto LAB_001013b9;
      }
      bVar1 = false;
      local_440 = local_444;
    }
    else {
      puts("Invalid number entered!");
      __isoc99_scanf("%*[^\n]");
LAB_001013b9:
      bVar1 = true;
    }
    if (!bVar1) {
      return local_440;
    }
  } while( true );
}

Assistant:

int query_int(const char* prompt, const int minimum, const int maximum) {
  while (true) {
    char str[1024];
    int res = 0;

    printf("%s", prompt);

    if (!fgets(str, 1024, stdin)) exit(1);

    const int scanf_res = sscanf(str, "%d", &res);

    if (scanf_res != 1) {
      printf("Invalid number entered!\n");
      scanf("%*[^\n]");
    } else if (res < minimum || res > maximum) {
      printf("Invalid number entered!\n");
    } else {
      return res;
    }
  }
}